

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O3

void __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::unRef
          (KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *this)

{
  RefCounter *pRVar1;
  LayerHeader *pLVar2;
  
  if (this->m_pRef != (LayerHeader *)0x0) {
    pRVar1 = this->m_piCount;
    *pRVar1 = *pRVar1 - 1;
    if (*pRVar1 == 0) {
      operator_delete(pRVar1,2);
      pLVar2 = this->m_pRef;
      if (pLVar2 != (LayerHeader *)0x0) {
        (*(pLVar2->super_DataTypeBase)._vptr_DataTypeBase[1])();
      }
      this->m_pRef = (LayerHeader *)0x0;
      this->m_piCount = (RefCounter *)0x0;
    }
  }
  return;
}

Assistant:

void unRef()
    {
        if( m_pRef )
        {
            --( *m_piCount );
            if( *m_piCount == 0 )
            {
                delete m_piCount;
                delete m_pRef;
                m_piCount = NULL;
                m_pRef = NULL;
            }
        }
    }